

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::build(Arcflow *this)

{
  int iVar1;
  runtime_error *this_00;
  size_type sVar2;
  set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *this_01;
  vector<int,_std::allocator<int>_> local_190;
  _Base_ptr local_178;
  _Rb_tree_const_iterator<Arc> local_170;
  allocator<int> local_165;
  value_type local_164;
  vector<int,_std::allocator<int>_> local_160;
  allocator<int> local_145;
  value_type local_144;
  vector<int,_std::allocator<int>_> local_140;
  char local_118 [8];
  char _error_msg_ [256];
  Arcflow *this_local;
  
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x168);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&this->dp);
  std::vector<Arc,_std::allocator<Arc>_>::clear(&this->A);
  NodeSet::clear(&this->NS);
  if (((this->inst).binary & 1U) == 0) {
    iVar1 = this->label_size;
    local_164 = 0;
    std::allocator<int>::allocator(&local_165);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_160,(long)(iVar1 + 2),&local_164,&local_165);
    go(this);
    std::vector<int,_std::allocator<int>_>::~vector(&local_160);
    std::allocator<int>::~allocator(&local_165);
  }
  else {
    iVar1 = this->label_size;
    local_144 = 0;
    std::allocator<int>::allocator(&local_145);
    std::vector<int,_std::allocator<int>_>::vector(&local_140,(long)iVar1,&local_144,&local_145);
    go(this);
    std::vector<int,_std::allocator<int>_>::~vector(&local_140);
    std::allocator<int>::~allocator(&local_145);
  }
  sVar2 = std::
          map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::size(&this->dp);
  printf("  #dp: %d\n",sVar2 & 0xffffffff);
  std::
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&this->dp);
  this_01 = &this->AS;
  local_170._M_node = (_Base_ptr)std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::begin(this_01)
  ;
  local_178 = (_Base_ptr)std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::end(this_01);
  std::vector<Arc,std::allocator<Arc>>::assign<std::_Rb_tree_const_iterator<Arc>,void>
            ((vector<Arc,std::allocator<Arc>> *)&this->A,local_170,
             (_Rb_tree_const_iterator<Arc>)local_178);
  std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::clear(this_01);
  NodeSet::topological_order(&local_190,&this->NS);
  relabel_graph(this,&local_190);
  std::vector<int,_std::allocator<int>_>::~vector(&local_190);
  NodeSet::sort(&this->NS);
  return;
}

Assistant:

void Arcflow::build() {
	throw_assert(ready == false);
	dp.clear();
	A.clear();
	NS.clear();

	if (inst.binary) {
		go(std::vector<int>(label_size, 0));
	} else {
		go(std::vector<int>(label_size + 2, 0));
	}

	printf("  #dp: %d\n", static_cast<int>(dp.size()));

	dp.clear();
	A.assign(all(AS));
	AS.clear();

	relabel_graph(NS.topological_order());
	NS.sort();
}